

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asserterror.h
# Opt level: O1

void __thiscall
trun::AssertError::Add
          (AssertError *this,kAssertClass aClass,int pLine,string *pFile,string *pMessage)

{
  pointer pcVar1;
  AssertErrorItem item;
  undefined1 local_68 [8];
  _Alloc_hider local_60;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_50;
  _Alloc_hider local_40;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_30;
  
  pcVar1 = (pFile->_M_dataplus)._M_p;
  local_68[0] = aClass;
  local_68._4_4_ = pLine;
  local_60._M_p = (pointer)&local_50;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_60,pcVar1,pcVar1 + pFile->_M_string_length);
  pcVar1 = (pMessage->_M_dataplus)._M_p;
  local_40._M_p = (pointer)&local_30;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_40,pcVar1,pcVar1 + pMessage->_M_string_length);
  std::
  vector<trun::AssertError::AssertErrorItem,_std::allocator<trun::AssertError::AssertErrorItem>_>::
  push_back(&this->assertErrors,(value_type *)local_68);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_p != &local_30) {
    operator_delete(local_40._M_p,local_30._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_p != &local_50) {
    operator_delete(local_60._M_p,local_50._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void Add(kAssertClass aClass, int pLine, std::string pFile, std::string pMessage) {
            auto item = AssertErrorItem {
                .assertClass = aClass,
                .line = pLine,
                .file = pFile,
                .message = pMessage
            };
            assertErrors.push_back(item);
        }